

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_4,_3> *
tcu::operator*(Matrix<float,_4,_3> *__return_storage_ptr__,Matrix<float,_4,_3> *mtx,float scalar)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Vector<float,_4> *pVVar8;
  long lVar9;
  Matrix<float,_4,_3> *res;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  bool bVar14;
  undefined4 uVar15;
  long lVar13;
  
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  pVVar8 = (__return_storage_ptr__->m_data).m_data;
  pVVar8[2].m_data[2] = 0.0;
  pVVar8[2].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  pVVar8 = (__return_storage_ptr__->m_data).m_data;
  pVVar8[1].m_data[2] = 0.0;
  pVVar8[1].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  auVar7 = _DAT_019f34d0;
  auVar6 = _DAT_019ec5b0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  pVVar8 = (__return_storage_ptr__->m_data).m_data + 1;
  lVar9 = 0;
  lVar10 = 0;
  do {
    lVar11 = 0;
    auVar12 = auVar7;
    do {
      bVar14 = SUB164(auVar12 ^ auVar6,4) == -0x80000000 && SUB164(auVar12 ^ auVar6,0) < -0x7ffffffd
      ;
      if (bVar14) {
        uVar15 = 0x3f800000;
        if (lVar9 != lVar11) {
          uVar15 = 0;
        }
        *(undefined4 *)
         ((long)((Vector<tcu::Vector<float,_4>,_3> *)(pVVar8 + -1))->m_data[0].m_data + lVar11) =
             uVar15;
      }
      if (bVar14) {
        uVar15 = 0x3f800000;
        if (lVar9 + -0x10 != lVar11) {
          uVar15 = 0;
        }
        *(undefined4 *)((long)pVVar8->m_data + lVar11) = uVar15;
      }
      lVar13 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar13 + 2;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0x40);
    lVar10 = lVar10 + 1;
    lVar9 = lVar9 + 0x10;
    pVVar8 = (Vector<float,_4> *)(pVVar8->m_data + 1);
  } while (lVar10 != 4);
  lVar9 = 0;
  do {
    pfVar1 = (float *)((long)(mtx->m_data).m_data[0].m_data + lVar9);
    fVar3 = pfVar1[1];
    fVar4 = pfVar1[2];
    fVar5 = pfVar1[3];
    pfVar2 = (float *)((long)(__return_storage_ptr__->m_data).m_data[0].m_data + lVar9);
    *pfVar2 = *pfVar1 * scalar;
    pfVar2[1] = fVar3 * scalar;
    pfVar2[2] = fVar4 * scalar;
    pfVar2[3] = fVar5 * scalar;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x30);
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows, Cols> operator* (const Matrix<T, Rows, Cols>& mtx, T scalar)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = mtx(row, col) * scalar;
	return res;
}